

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_left_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint16_t *in_RCX;
  ptrdiff_t in_RSI;
  uint16_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i dc;
  __m128i sum;
  __m128i four;
  ushort local_b8;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  undefined8 local_98;
  undefined8 uStack_90;
  ptrdiff_t local_68;
  uint16_t *local_60;
  undefined1 local_58 [16];
  undefined4 local_40;
  undefined4 local_3c;
  ushort local_38;
  ushort uStack_36;
  ushort uStack_34;
  ushort uStack_32;
  ushort uStack_30;
  ushort uStack_2e;
  ushort uStack_2c;
  ushort uStack_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  local_40 = 4;
  local_58 = ZEXT416(4);
  local_98 = local_58._0_8_;
  uStack_90 = 0;
  local_68 = in_RSI;
  local_60 = in_RDI;
  dc_sum_8(in_RCX);
  local_28 = local_98;
  uVar1 = local_28;
  uStack_20 = uStack_90;
  uVar2 = uStack_20;
  local_18 = (short)extraout_XMM0_Qa;
  sStack_16 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  sStack_14 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  sStack_12 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  sStack_10 = (short)extraout_XMM0_Qb;
  sStack_e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
  sStack_c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
  sStack_a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
  local_28._0_2_ = (short)local_98;
  local_28._2_2_ = (short)((ulong)local_98 >> 0x10);
  local_28._4_2_ = (short)((ulong)local_98 >> 0x20);
  local_28._6_2_ = (short)((ulong)local_98 >> 0x30);
  uStack_20._0_2_ = (short)uStack_90;
  uStack_20._2_2_ = (short)((ulong)uStack_90 >> 0x10);
  uStack_20._4_2_ = (short)((ulong)uStack_90 >> 0x20);
  uStack_20._6_2_ = (short)((ulong)uStack_90 >> 0x30);
  local_38 = local_18 + (short)local_28;
  uStack_36 = sStack_16 + local_28._2_2_;
  uStack_34 = sStack_14 + local_28._4_2_;
  uStack_32 = sStack_12 + local_28._6_2_;
  uStack_30 = sStack_10 + (short)uStack_20;
  uStack_2e = sStack_e + uStack_20._2_2_;
  uStack_2c = sStack_c + uStack_20._4_2_;
  uStack_2a = sStack_a + uStack_20._6_2_;
  local_3c = 3;
  local_b8 = local_38 >> 3;
  uStack_b6 = uStack_36 >> 3;
  uStack_b4 = uStack_34 >> 3;
  uStack_b2 = uStack_32 >> 3;
  uStack_b0 = uStack_30 >> 3;
  uStack_ae = uStack_2e >> 3;
  uStack_ac = uStack_2c >> 3;
  uStack_aa = uStack_2a >> 3;
  local_28 = uVar1;
  uStack_20 = uVar2;
  dc_store_16xh(local_60,local_68,8,(__m128i *)&local_b8);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_16x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  const __m128i four = _mm_cvtsi32_si128(4);
  const __m128i sum = dc_sum_8(left);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, four), 3);
  (void)above;
  (void)bd;
  dc_store_16xh(dst, stride, 8, &dc);
}